

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RingDecomposerLib.c
# Opt level: O1

uint RDL_getEdgeArray(RDL_data *data,RDL_edge **ptr)

{
  RDL_graph *pRVar1;
  uint **ppuVar2;
  RDL_node *pRVar3;
  uint uVar4;
  RDL_edge *paRVar5;
  ulong uVar6;
  
  if (data == (RDL_data *)0x0) {
    (*RDL_outputFunc)(RDL_ERROR,"RDL_data is NULL!\n");
    paRVar5 = (RDL_edge *)malloc(8);
    *ptr = paRVar5;
    uVar4 = 0xffffffff;
  }
  else {
    pRVar1 = data->graph;
    uVar4 = pRVar1->E;
    paRVar5 = (RDL_edge *)malloc((ulong)uVar4 * 8);
    if ((ulong)uVar4 != 0) {
      ppuVar2 = pRVar1->edges;
      uVar6 = 0;
      do {
        pRVar3 = ppuVar2[uVar6];
        paRVar5[uVar6][0] = *pRVar3;
        paRVar5[uVar6][1] = pRVar3[1];
        uVar6 = uVar6 + 1;
      } while (uVar6 < pRVar1->E);
    }
    *ptr = paRVar5;
    uVar4 = data->graph->E;
  }
  return uVar4;
}

Assistant:

unsigned RDL_getEdgeArray(const RDL_data *data, RDL_edge **ptr)
{
  RDL_edge *result;
  unsigned idx;

  if (!data) {
    RDL_outputFunc(RDL_ERROR, "RDL_data is NULL!\n");
    (*ptr) = malloc(sizeof(**ptr));
    return RDL_INVALID_RESULT;
  }

  result = malloc(data->graph->E * sizeof(*result));
  for(idx=0; idx<data->graph->E; ++idx)
  {
    result[idx][0] = data->graph->edges[idx][0];
    result[idx][1] = data->graph->edges[idx][1];
  }
  (*ptr) = result;
  return data->graph->E;
}